

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O1

string * __thiscall
Diligent::BasicFileSystem::FileDialog_abi_cxx11_
          (string *__return_storage_ptr__,BasicFileSystem *this,FileDialogAttribs *DialogAttribs)

{
  string _msg;
  string local_28;
  
  FormatString<char[48]>(&local_28,(char (*) [48])"File dialog is not implemented on this platform")
  ;
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(1,local_28._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string BasicFileSystem::FileDialog(const FileDialogAttribs& DialogAttribs)
{
    LOG_WARNING_MESSAGE("File dialog is not implemented on this platform");
    return "";
}